

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O1

void SplitPoly(FPolyNode *pnode,void *node,float *bbox)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  FPolySeg *pFVar6;
  bool bVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  long lVar12;
  long lVar13;
  FPolyNode *pFVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  int iVar18;
  FPolySeg *item;
  long lVar19;
  void *node_00;
  ulong uVar20;
  float *bbox_00;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  double dVar27;
  float fVar28;
  float fVar29;
  double local_50;
  double local_48;
  
  if (SplitPoly(FPolyNode*,void*,float*)::lists == '\0') {
    SplitPoly();
  }
  if (((ulong)node & 1) != 0) {
    pFVar14 = *(FPolyNode **)((long)node + 7);
    pnode->pnext = pFVar14;
    if (pFVar14 != (FPolyNode *)0x0) {
      if (pFVar14->state != 0x539) {
        __assert_fail("pnode->pnext->state == 1337",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/po_man.cpp"
                      ,0x82a,"void SplitPoly(FPolyNode *, void *, float *)");
      }
      pFVar14->pprev = pnode;
    }
    pnode->pprev = (FPolyNode *)0x0;
    *(FPolyNode **)((long)node + 7) = pnode;
    pnode->snext = pnode->poly->subsectorlinks;
    pnode->poly->subsectorlinks = pnode;
    pnode->subsector = (subsector_t *)((long)node + -1);
    uVar20 = (ulong)(pnode->segs).Count;
    if (uVar20 == 0) {
      __assert_fail("pnode->segs.Size() != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/po_man.cpp"
                    ,0x836,"void SplitPoly(FPolyNode *, void *, float *)");
    }
    pFVar6 = (pnode->segs).Array;
    fVar23 = 3.4028235e+38;
    fVar24 = 3.4028235e+38;
    fVar22 = 1.1754944e-38;
    lVar12 = 0;
    fVar21 = 1.1754944e-38;
    do {
      fVar25 = (float)*(double *)((long)&(pFVar6->v1).pos.X + lVar12);
      fVar26 = (float)*(double *)((long)&(pFVar6->v1).pos.Y + lVar12);
      fVar28 = fVar25;
      if (fVar24 <= fVar25) {
        fVar28 = fVar24;
      }
      if (fVar25 <= fVar21) {
        fVar25 = fVar21;
      }
      fVar29 = fVar26;
      if (fVar23 <= fVar26) {
        fVar29 = fVar23;
      }
      fVar21 = (float)*(double *)((long)&(pFVar6->v2).pos.X + lVar12);
      if (fVar26 <= fVar22) {
        fVar26 = fVar22;
      }
      fVar22 = (float)*(double *)((long)&(pFVar6->v2).pos.Y + lVar12);
      fVar24 = fVar21;
      if (fVar28 <= fVar21) {
        fVar24 = fVar28;
      }
      if (fVar21 <= fVar25) {
        fVar21 = fVar25;
      }
      fVar23 = fVar22;
      if (fVar29 <= fVar22) {
        fVar23 = fVar29;
      }
      if (fVar22 <= fVar26) {
        fVar22 = fVar26;
      }
      lVar12 = lVar12 + 0x28;
    } while (uVar20 * 0x28 != lVar12);
    if (*bbox <= fVar22 && fVar22 != *bbox) {
      *bbox = fVar22;
    }
    if (fVar23 < bbox[1]) {
      bbox[1] = fVar23;
    }
    if (fVar24 < bbox[2]) {
      bbox[2] = fVar24;
    }
    if (bbox[3] <= fVar21 && fVar21 != bbox[3]) {
      bbox[3] = fVar21;
    }
    return;
  }
  if (SplitPoly::lists[0].Count != 0) {
    SplitPoly::lists[0].Count = 0;
  }
  if (SplitPoly::lists[1].Count != 0) {
    SplitPoly::lists[1].Count = 0;
  }
  if ((pnode->segs).Count != 0) {
    lVar12 = ((long)*node - (long)SUB84((pnode->poly->CenterSpot).pos.X + 103079215104.0,0)) *
             (long)*(int *)((long)node + 0xc) +
             ((long)SUB84((pnode->poly->CenterSpot).pos.Y + 103079215104.0,0) -
             (long)*(int *)((long)node + 4)) * (long)*(int *)((long)node + 8);
    lVar19 = 0x10;
    uVar20 = 0;
    do {
      pFVar6 = (pnode->segs).Array;
      item = (FPolySeg *)((long)pFVar6 + lVar19 + -0x10);
      dVar9 = PartitionDistance((FPolyVertex *)item,(node_t *)node);
      dVar10 = PartitionDistance((FPolyVertex *)((long)&(pFVar6->v1).pos.X + lVar19),(node_t *)node)
      ;
      if (dVar9 <= 0.3125) {
        bVar7 = (int)((ulong)lVar12 >> 0x20) != 0 && -1 < lVar12;
        if (0.3125 < dVar10) {
          iVar18 = (int)((ulong)((long)*(int *)((long)node + 0xc) *
                                 ((long)*node -
                                 (long)SUB84(*(double *)((long)&(pFVar6->v1).pos.X + lVar19) +
                                             103079215104.0,0)) +
                                (long)*(int *)((long)node + 8) *
                                ((long)SUB84(*(double *)((long)&(pFVar6->v1).pos.Y + lVar19) +
                                             103079215104.0,0) - (long)*(int *)((long)node + 4))) >>
                        0x20);
          goto LAB_00473b1d;
        }
LAB_00473b2e:
        TArray<FPolySeg,_FPolySeg>::Push(SplitPoly::lists + bVar7,item);
      }
      else {
        dVar9 = *(double *)((long)pFVar6 + lVar19 + -0x10);
        dVar1 = *(double *)((long)pFVar6 + lVar19 + -8);
        iVar2 = *node;
        iVar3 = *(int *)((long)node + 4);
        iVar4 = *(int *)((long)node + 8);
        iVar5 = *(int *)((long)node + 0xc);
        lVar13 = (long)(iVar2 - SUB84(dVar9 + 103079215104.0,0)) * (long)iVar5 +
                 (long)(SUB84(dVar1 + 103079215104.0,0) - iVar3) * (long)iVar4;
        iVar18 = (int)((ulong)lVar13 >> 0x20);
        if (dVar10 <= 0.3125) {
LAB_00473b1d:
          bVar7 = 0 < iVar18;
          goto LAB_00473b2e;
        }
        dVar10 = *(double *)((long)&(pFVar6->v1).pos.X + lVar19);
        lVar17 = (long)(iVar2 - SUB84(dVar10 + 103079215104.0,0)) * (long)iVar5 +
                 (long)(SUB84(*(double *)((long)&(pFVar6->v1).pos.Y + lVar19) + 103079215104.0,0) -
                       iVar3) * (long)iVar4;
        iVar15 = (int)((ulong)lVar17 >> 0x20);
        if ((iVar18 != 0 && -1 < lVar13) == (iVar15 != 0 && -1 < lVar17)) goto LAB_00473b1d;
        dVar10 = dVar10 - dVar9;
        dVar11 = *(double *)((long)&(pFVar6->v1).pos.Y + lVar19) - dVar1;
        dVar27 = (double)iVar5 * 1.52587890625e-05 * dVar10 -
                 (double)iVar4 * 1.52587890625e-05 * dVar11;
        if ((dVar27 != 0.0) || (NAN(dVar27))) {
          dVar27 = ((double)iVar4 * 1.52587890625e-05 * (dVar1 - (double)iVar3 * 1.52587890625e-05)
                   + ((double)iVar2 * 1.52587890625e-05 - dVar9) * (double)iVar5 * 1.52587890625e-05
                   ) / dVar27;
          bVar7 = false;
          if ((0.0 <= dVar27) && (dVar27 <= 1.0)) {
            local_48 = dVar9 + dVar10 * dVar27;
            local_50 = dVar1 + dVar11 * dVar27;
            bVar7 = true;
          }
        }
        else {
          bVar7 = false;
        }
        if (!bVar7) goto LAB_00473b1d;
        bVar7 = iVar15 != 0 && -1 < lVar17;
        bVar8 = iVar18 != 0 && -1 < lVar13;
        TArray<FPolySeg,_FPolySeg>::Push(SplitPoly::lists,item);
        TArray<FPolySeg,_FPolySeg>::Push(SplitPoly::lists + 1,item);
        pFVar6 = SplitPoly::lists[bVar8].Array;
        uVar16 = SplitPoly::lists[bVar8].Count - 1;
        pFVar6[uVar16].v2.pos.Y = local_50;
        pFVar6[uVar16].v2.pos.X = local_48;
        pFVar6 = SplitPoly::lists[bVar7].Array;
        uVar16 = SplitPoly::lists[bVar7].Count - 1;
        pFVar6[uVar16].v1.pos.Y = local_50;
        pFVar6[uVar16].v1.pos.X = local_48;
      }
      uVar20 = uVar20 + 1;
      lVar19 = lVar19 + 0x28;
    } while (uVar20 < (pnode->segs).Count);
  }
  if (SplitPoly::lists[1].Count == 0) {
    node_00 = *(void **)((long)node + 0x38);
    bbox_00 = (float *)((long)node + 0x10);
  }
  else {
    if (SplitPoly::lists[0].Count != 0) {
      if (FreePolyNodes == (FPolyNode *)0x0) {
        pFVar14 = (FPolyNode *)operator_new(0x40);
        (pFVar14->segs).Array = (FPolySeg *)0x0;
        (pFVar14->segs).Most = 0;
        (pFVar14->segs).Count = 0;
      }
      else {
        pFVar14 = FreePolyNodes;
        FreePolyNodes = FreePolyNodes->pnext;
      }
      pFVar14->state = 0x539;
      pFVar14->poly = (FPolyObj *)0x0;
      pFVar14->pnext = (FPolyNode *)0x0;
      pFVar14->pprev = (FPolyNode *)0x0;
      pFVar14->subsector = (subsector_t *)0x0;
      pFVar14->snext = (FPolyNode *)0x0;
      pFVar14->poly = pnode->poly;
      TArray<FPolySeg,_FPolySeg>::operator=(&pFVar14->segs,SplitPoly::lists + 1);
      TArray<FPolySeg,_FPolySeg>::operator=(&pnode->segs,SplitPoly::lists);
      bbox_00 = (float *)((long)node + 0x20);
      SplitPoly(pFVar14,*(void **)((long)node + 0x40),bbox_00);
      SplitPoly(pnode,*(void **)((long)node + 0x38),(float *)((long)node + 0x10));
      AddToBBox((float *)((long)node + 0x10),bbox);
      goto LAB_00473d57;
    }
    node_00 = *(void **)((long)node + 0x40);
    bbox_00 = (float *)((long)node + 0x20);
  }
  SplitPoly(pnode,node_00,bbox_00);
LAB_00473d57:
  AddToBBox(bbox_00,bbox);
  return;
}

Assistant:

static void SplitPoly(FPolyNode *pnode, void *node, float bbox[4])
{
	static TArray<FPolySeg> lists[2];
	static const double POLY_EPSILON = 0.3125;

	if (!((size_t)node & 1))  // Keep going until found a subsector
	{
		node_t *bsp = (node_t *)node;

		int centerside = R_PointOnSide(pnode->poly->CenterSpot.pos, bsp);

		lists[0].Clear();
		lists[1].Clear();
		for(unsigned i=0;i<pnode->segs.Size(); i++)
		{
			FPolySeg *seg = &pnode->segs[i];

			// Parts of the following code were taken from Eternity and are
			// being used with permission.

			// get distance of vertices from partition line
			// If the distance is too small, we may decide to
			// change our idea of sidedness.
			double dist_v1 = PartitionDistance(&seg->v1, bsp);
			double dist_v2 = PartitionDistance(&seg->v2, bsp);

			// If the distances are less than epsilon, consider the points as being
			// on the same side as the polyobj origin. Why? People like to build
			// polyobject doors flush with their door tracks. This breaks using the
			// usual assumptions.
			

			// Addition to Eternity code: We must also check any seg with only one
			// vertex inside the epsilon threshold. If not, these lines will get split but
			// adjoining ones with both vertices inside the threshold won't thus messing up
			// the order in which they get drawn.

			if(dist_v1 <= POLY_EPSILON)
			{
				if (dist_v2 <= POLY_EPSILON)
				{
					lists[centerside].Push(*seg);
				}
				else
				{
					int side = R_PointOnSide(seg->v2.pos, bsp);
					lists[side].Push(*seg);
				}
			}
			else if (dist_v2 <= POLY_EPSILON)
			{
				int side = R_PointOnSide(seg->v1.pos, bsp);
				lists[side].Push(*seg);
			}
			else 
			{
				int side1 = R_PointOnSide(seg->v1.pos, bsp);
				int side2 = R_PointOnSide(seg->v2.pos, bsp);

				if(side1 != side2)
				{
					// if the partition line crosses this seg, we must split it.

					FPolyVertex vert;

					if (GetIntersection(seg, bsp, &vert))
					{
						lists[0].Push(*seg);
						lists[1].Push(*seg);
						lists[side1].Last().v2 = vert;
						lists[side2].Last().v1 = vert;
					}
					else
					{
						// should never happen
						lists[side1].Push(*seg);
					}
				}
				else 
				{
					// both points on the same side.
					lists[side1].Push(*seg);
				}
			}
		}
		if (lists[1].Size() == 0)
		{
			SplitPoly(pnode, bsp->children[0], bsp->bbox[0]);
			AddToBBox(bsp->bbox[0], bbox);
		}
		else if (lists[0].Size() == 0)
		{
			SplitPoly(pnode, bsp->children[1], bsp->bbox[1]);
			AddToBBox(bsp->bbox[1], bbox);
		}
		else
		{
			// create the new node 
			FPolyNode *newnode = NewPolyNode();
			newnode->poly = pnode->poly;
			newnode->segs = lists[1];

			// set segs for original node
			pnode->segs = lists[0];
		
			// recurse back side
			SplitPoly(newnode, bsp->children[1], bsp->bbox[1]);
			
			// recurse front side
			SplitPoly(pnode, bsp->children[0], bsp->bbox[0]);

			AddToBBox(bsp->bbox[0], bbox);
			AddToBBox(bsp->bbox[1], bbox);
		}
	}
	else
	{
		// we reached a subsector so we can link the node with this subsector
		subsector_t *sub = (subsector_t *)((BYTE *)node - 1);

		// Link node to subsector
		pnode->pnext = sub->polys;
		if (pnode->pnext != NULL) 
		{
			assert(pnode->pnext->state == 1337);
			pnode->pnext->pprev = pnode;
		}
		pnode->pprev = NULL;
		sub->polys = pnode;

		// link node to polyobject
		pnode->snext = pnode->poly->subsectorlinks;
		pnode->poly->subsectorlinks = pnode;
		pnode->subsector = sub;

		// calculate bounding box for this polynode
		assert(pnode->segs.Size() != 0);
		float subbbox[4] = { FLT_MIN, FLT_MAX, FLT_MAX, FLT_MIN };

		for (unsigned i = 0; i < pnode->segs.Size(); ++i)
		{
			AddToBBox(&pnode->segs[i].v1, subbbox);
			AddToBBox(&pnode->segs[i].v2, subbbox);
		}
		// Potentially expand the parent node's bounding box to contain these bits of polyobject.
		AddToBBox(subbbox, bbox);
	}
}